

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDElementDecl::faultInAttDefList(DTDElementDecl *this)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  
  pRVar4 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x38,(this->super_XMLElementDecl).fMemoryManager);
  pMVar1 = (this->super_XMLElementDecl).fMemoryManager;
  pRVar4->fMemoryManager = pMVar1;
  pRVar4->fAdoptedElems = true;
  pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> **)0x0;
  pRVar4->fHashModulus = 0x1d;
  pRVar4->fInitialModulus = 0x1d;
  pRVar4->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0xe8);
  pRVar4->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> **)CONCAT44(extraout_var,iVar3);
  XVar2 = pRVar4->fHashModulus;
  if (XVar2 != 0) {
    XVar5 = 0;
    do {
      pRVar4->fBucketList[XVar5] = (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0;
      XVar5 = XVar5 + 1;
    } while (XVar2 != XVar5);
  }
  this->fAttDefs = pRVar4;
  return;
}

Assistant:

void DTDElementDecl::faultInAttDefList() const
{
    // Use a hash modulus of 29 and tell it owns its elements
    ((DTDElementDecl*)this)->fAttDefs = new (getMemoryManager()) RefHashTableOf<DTDAttDef>(29, true, getMemoryManager());
}